

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_extend_vector(flatcc_builder_t *B,size_t count)

{
  int iVar1;
  size_t count_local;
  flatcc_builder_t *B_local;
  
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,(B->frame->container).vector.max_count);
  if (iVar1 == 0) {
    B_local = (flatcc_builder_t *)
              push_ds(B,(B->frame->container).table.vs_end * (flatbuffers_uoffset_t)count);
  }
  else {
    B_local = (flatcc_builder_t *)0x0;
  }
  return B_local;
}

Assistant:

void *flatcc_builder_extend_vector(flatcc_builder_t *B, size_t count)
{
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds(B, frame(container.vector.elem_size) * (uoffset_t)count);
}